

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O2

int __thiscall llvm::StringRef::compare_numeric(StringRef *this,StringRef RHS)

{
  byte bVar1;
  byte bVar2;
  char *pcVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  uint unaff_EBX;
  uint uVar9;
  ulong uVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  char cVar17;
  bool bVar18;
  bool bVar19;
  
  uVar7 = RHS.Length;
  pcVar11 = RHS.Data;
  pcVar3 = this->Data;
  uVar4 = this->Length;
  uVar15 = uVar7;
  if (uVar4 < uVar7) {
    uVar15 = uVar4;
  }
  uVar10 = 0;
  do {
    if (uVar10 == uVar15) {
      uVar9 = 0;
      if (uVar4 != uVar7) {
        bVar19 = uVar4 < uVar7;
LAB_00152d3b:
        uVar9 = -(uint)bVar19 | 1;
      }
      return uVar9;
    }
    bVar1 = pcVar3[uVar10];
    bVar2 = pcVar11[uVar10];
    if ((byte)(bVar2 - 0x30) < 10 && (byte)(bVar1 - 0x30) < 10) {
      lVar6 = 0;
      pcVar12 = pcVar11;
      pcVar13 = pcVar3;
      do {
        pcVar13 = pcVar13 + 1;
        pcVar12 = pcVar12 + 1;
        lVar8 = uVar15 + 1;
        uVar16 = uVar15;
        if ((uVar10 - uVar15) + lVar6 == 0) goto LAB_00152cf6;
        uVar16 = uVar10 + lVar6 + 1;
        uVar9 = 0;
        if (uVar16 < uVar4) {
          uVar9 = (uint)((byte)(pcVar13[uVar10] - 0x30U) < 10);
        }
        uVar14 = 1;
        if (uVar16 < uVar7) {
          bVar18 = (byte)(pcVar12[uVar10] - 0x30U) < 10;
          uVar14 = (uint)bVar18;
          bVar19 = uVar9 == uVar14;
          uVar14 = -uVar14 | 1;
          cVar17 = !bVar18 * '\x05';
        }
        else {
          bVar19 = uVar9 == 0;
          cVar17 = '\x05';
        }
        if (!bVar19) {
          unaff_EBX = uVar14;
          cVar17 = '\x01';
        }
        lVar6 = lVar6 + 1;
      } while (cVar17 == '\0');
      if (cVar17 != '\x05') {
        return unaff_EBX;
      }
      lVar8 = uVar10 + lVar6;
      uVar16 = (uVar10 + lVar6) - 1;
LAB_00152cf6:
      if ((lVar8 - uVar10 != 0) &&
         (iVar5 = memcmp(pcVar3 + uVar10,pcVar11 + uVar10,lVar8 - uVar10), iVar5 != 0)) {
        return iVar5 >> 0x1f | 1;
      }
    }
    else {
      uVar16 = uVar10;
      if (bVar1 != bVar2) {
        bVar19 = bVar1 < bVar2;
        goto LAB_00152d3b;
      }
    }
    uVar10 = uVar16 + 1;
  } while( true );
}

Assistant:

int StringRef::compare_numeric(StringRef RHS) const {
  for (size_t I = 0, E = std::min(Length, RHS.Length); I != E; ++I) {
    // Check for sequences of digits.
    if (isDigit(Data[I]) && isDigit(RHS.Data[I])) {
      // The longer sequence of numbers is considered larger.
      // This doesn't really handle prefixed zeros well.
      size_t J;
      for (J = I + 1; J != E + 1; ++J) {
        bool ld = J < Length && isDigit(Data[J]);
        bool rd = J < RHS.Length && isDigit(RHS.Data[J]);
        if (ld != rd)
          return rd ? -1 : 1;
        if (!rd)
          break;
      }
      // The two number sequences have the same length (J-I), just memcmp them.
      if (int Res = compareMemory(Data + I, RHS.Data + I, J - I))
        return Res < 0 ? -1 : 1;
      // Identical number sequences, continue search after the numbers.
      I = J - 1;
      continue;
    }
    if (Data[I] != RHS.Data[I])
      return (unsigned char)Data[I] < (unsigned char)RHS.Data[I] ? -1 : 1;
  }
  if (Length == RHS.Length)
    return 0;
  return Length < RHS.Length ? -1 : 1;
}